

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O3

int doh_done(Curl_easy *doh,CURLcode result)

{
  doh_probes *pdVar1;
  curl_trc_feat *pcVar2;
  Curl_easy *data;
  char *pcVar3;
  
  data = Curl_multi_get_handle(doh->multi,(doh->set).dohfor_mid);
  if (data != (Curl_easy *)0x0) {
    pdVar1 = (data->req).doh;
    pdVar1->pending = pdVar1->pending - 1;
    if ((((doh->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar2 = (doh->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(doh,"a DoH request is completed, %u to go");
    }
    if (((result != CURLE_OK) && (((doh->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar2 = (doh->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      pcVar3 = curl_easy_strerror(result);
      Curl_infof(doh,"DoH request %s",pcVar3);
    }
    if (pdVar1->pending == 0) {
      Curl_expire(data,0,EXPIRE_RUN_NOW);
    }
  }
  return 0;
}

Assistant:

static int doh_done(struct Curl_easy *doh, CURLcode result)
{
  struct Curl_easy *data; /* the transfer that asked for the DoH probe */

  data = Curl_multi_get_handle(doh->multi, doh->set.dohfor_mid);
  if(!data) {
    DEBUGF(infof(doh, "doh_done: xfer for mid=%" FMT_OFF_T
                 " not found", doh->set.dohfor_mid));
    DEBUGASSERT(0);
  }
  else {
    struct doh_probes *dohp = data->req.doh;
    /* one of the DoH request done for the 'data' transfer is now complete! */
    dohp->pending--;
    infof(doh, "a DoH request is completed, %u to go", dohp->pending);
    if(result)
      infof(doh, "DoH request %s", curl_easy_strerror(result));

    if(!dohp->pending) {
      /* DoH completed, run the transfer picking up the results */
      Curl_expire(data, 0, EXPIRE_RUN_NOW);
    }
  }
  return 0;
}